

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O0

void __thiscall
vkt::Draw::PipelineCreateInfo::RasterizerState::RasterizerState
          (RasterizerState *this,VkBool32 _depthClampEnable,VkBool32 _rasterizerDiscardEnable,
          VkPolygonMode _polygonMode,VkCullModeFlags _cullMode,VkFrontFace _frontFace,
          VkBool32 _depthBiasEnable,float _depthBiasConstantFactor,float _depthBiasClamp,
          float _depthBiasSlopeFactor,float _lineWidth)

{
  float _lineWidth_local;
  float _depthBiasSlopeFactor_local;
  float _depthBiasClamp_local;
  float _depthBiasConstantFactor_local;
  VkFrontFace _frontFace_local;
  VkCullModeFlags _cullMode_local;
  VkPolygonMode _polygonMode_local;
  VkBool32 _rasterizerDiscardEnable_local;
  VkBool32 _depthClampEnable_local;
  RasterizerState *this_local;
  
  (this->super_VkPipelineRasterizationStateCreateInfo).sType =
       VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO;
  (this->super_VkPipelineRasterizationStateCreateInfo).pNext = (void *)0x0;
  (this->super_VkPipelineRasterizationStateCreateInfo).flags = 0;
  (this->super_VkPipelineRasterizationStateCreateInfo).depthClampEnable = _depthClampEnable;
  (this->super_VkPipelineRasterizationStateCreateInfo).rasterizerDiscardEnable =
       _rasterizerDiscardEnable;
  (this->super_VkPipelineRasterizationStateCreateInfo).polygonMode = _polygonMode;
  (this->super_VkPipelineRasterizationStateCreateInfo).cullMode = _cullMode;
  (this->super_VkPipelineRasterizationStateCreateInfo).frontFace = _frontFace;
  (this->super_VkPipelineRasterizationStateCreateInfo).depthBiasEnable = _depthBiasEnable;
  (this->super_VkPipelineRasterizationStateCreateInfo).depthBiasConstantFactor =
       _depthBiasConstantFactor;
  (this->super_VkPipelineRasterizationStateCreateInfo).depthBiasClamp = _depthBiasClamp;
  (this->super_VkPipelineRasterizationStateCreateInfo).depthBiasSlopeFactor = _depthBiasSlopeFactor;
  (this->super_VkPipelineRasterizationStateCreateInfo).lineWidth = _lineWidth;
  return;
}

Assistant:

PipelineCreateInfo::RasterizerState::RasterizerState (vk::VkBool32			_depthClampEnable,
													  vk::VkBool32			_rasterizerDiscardEnable,
													  vk::VkPolygonMode		_polygonMode,
													  vk::VkCullModeFlags	_cullMode,
													  vk::VkFrontFace		_frontFace,
													  vk::VkBool32			_depthBiasEnable,
													  float					_depthBiasConstantFactor,
													  float					_depthBiasClamp,
													  float					_depthBiasSlopeFactor,
													  float					_lineWidth)
{
	sType = vk::VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO;
	pNext = DE_NULL;
	flags					= 0u;
	depthClampEnable		= _depthClampEnable;
	rasterizerDiscardEnable = _rasterizerDiscardEnable;
	polygonMode				= _polygonMode;
	cullMode				= _cullMode;
	frontFace				= _frontFace;

	depthBiasEnable			= _depthBiasEnable;
	depthBiasConstantFactor	= _depthBiasConstantFactor;
	depthBiasClamp			= _depthBiasClamp;
	depthBiasSlopeFactor	= _depthBiasSlopeFactor;
	lineWidth				= _lineWidth;
}